

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,FILE *a_fpFile)

{
  int iVar1;
  size_t __n;
  char *a_pData;
  size_t a_uDataLen;
  ulong uVar2;
  SI_Error rc;
  size_t uRead;
  char *pData;
  long lSize;
  int retval;
  FILE *a_fpFile_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  iVar1 = fseek((FILE *)a_fpFile,0,2);
  if (iVar1 == 0) {
    __n = ftell((FILE *)a_fpFile);
    if ((long)__n < 0) {
      this_local._4_4_ = SI_FILE;
    }
    else if (__n == 0) {
      this_local._4_4_ = SI_OK;
    }
    else {
      uVar2 = __n + 1;
      if ((long)uVar2 < 0) {
        uVar2 = 0xffffffffffffffff;
      }
      a_pData = (char *)operator_new__(uVar2);
      if (a_pData == (char *)0x0) {
        this_local._4_4_ = SI_NOMEM;
      }
      else {
        a_pData[__n] = '\0';
        fseek((FILE *)a_fpFile,0,0);
        a_uDataLen = fread(a_pData,1,__n,(FILE *)a_fpFile);
        if (a_uDataLen == __n) {
          this_local._4_4_ = LoadData(this,a_pData,a_uDataLen);
          if (a_pData != (char *)0x0) {
            operator_delete__(a_pData);
          }
        }
        else {
          if (a_pData != (char *)0x0) {
            operator_delete__(a_pData);
          }
          this_local._4_4_ = SI_FILE;
        }
      }
    }
  }
  else {
    this_local._4_4_ = SI_FILE;
  }
  return this_local._4_4_;
}

Assistant:

SI_Error
CSimpleIniTempl<SI_CHAR,SI_STRLESS,SI_CONVERTER>::LoadFile(
    FILE * a_fpFile
    )
{
    // load the raw file data
    int retval = fseek(a_fpFile, 0, SEEK_END);
    if (retval != 0) {
        return SI_FILE;
    }
    long lSize = ftell(a_fpFile);
    if (lSize < 0) {
        return SI_FILE;
    }
    if (lSize == 0) {
        return SI_OK;
    }

    // allocate and ensure NULL terminated
    char * pData = new char[lSize+1];
    if (!pData) {
        return SI_NOMEM;
    }
    pData[lSize] = 0;

    // load data into buffer
    fseek(a_fpFile, 0, SEEK_SET);
    size_t uRead = fread(pData, sizeof(char), lSize, a_fpFile);
    if (uRead != (size_t) lSize) {
        delete[] pData;
        return SI_FILE;
    }

    // convert the raw data to unicode
    SI_Error rc = LoadData(pData, uRead);
    delete[] pData;
    return rc;
}